

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeCursor(Btree *p,int iTable,int wrFlag,KeyInfo *pKeyInfo,BtCursor *pCur)

{
  BtShared *pBt_00;
  u8 uVar1;
  Pgno PVar2;
  BtCursor *local_40;
  BtCursor *pX;
  BtShared *pBt;
  BtCursor *pCur_local;
  KeyInfo *pKeyInfo_local;
  int wrFlag_local;
  int iTable_local;
  Btree *p_local;
  
  pBt_00 = p->pBt;
  if ((wrFlag == 0) || (allocateTempSpace(pBt_00), pBt_00->pTmpSpace != (u8 *)0x0)) {
    pKeyInfo_local._4_4_ = iTable;
    if ((iTable == 1) && (PVar2 = btreePagecount(pBt_00), PVar2 == 0)) {
      pKeyInfo_local._4_4_ = 0;
    }
    pCur->pgnoRoot = pKeyInfo_local._4_4_;
    pCur->iPage = -1;
    pCur->pKeyInfo = pKeyInfo;
    pCur->pBtree = p;
    pCur->pBt = pBt_00;
    pCur->curFlags = wrFlag != 0;
    uVar1 = '\x02';
    if (wrFlag != 0) {
      uVar1 = '\0';
    }
    pCur->curPagerFlags = uVar1;
    for (local_40 = pBt_00->pCursor; local_40 != (BtCursor *)0x0; local_40 = local_40->pNext) {
      if (local_40->pgnoRoot == pKeyInfo_local._4_4_) {
        local_40->curFlags = local_40->curFlags | 0x20;
        pCur->curFlags = pCur->curFlags | 0x20;
      }
    }
    pCur->pNext = pBt_00->pCursor;
    pBt_00->pCursor = pCur;
    pCur->eState = '\x01';
    p_local._4_4_ = 0;
  }
  else {
    p_local._4_4_ = 7;
  }
  return p_local._4_4_;
}

Assistant:

static int btreeCursor(
  Btree *p,                              /* The btree */
  int iTable,                            /* Root page of table to open */
  int wrFlag,                            /* 1 to write. 0 read-only */
  struct KeyInfo *pKeyInfo,              /* First arg to comparison function */
  BtCursor *pCur                         /* Space for new cursor */
){
  BtShared *pBt = p->pBt;                /* Shared b-tree handle */
  BtCursor *pX;                          /* Looping over other all cursors */

  assert( sqlite3BtreeHoldsMutex(p) );
  assert( wrFlag==0 
       || wrFlag==BTREE_WRCSR 
       || wrFlag==(BTREE_WRCSR|BTREE_FORDELETE) 
  );

  /* The following assert statements verify that if this is a sharable 
  ** b-tree database, the connection is holding the required table locks, 
  ** and that no other connection has any open cursor that conflicts with 
  ** this lock.  */
  assert( hasSharedCacheTableLock(p, iTable, pKeyInfo!=0, (wrFlag?2:1)) );
  assert( wrFlag==0 || !hasReadConflicts(p, iTable) );

  /* Assert that the caller has opened the required transaction. */
  assert( p->inTrans>TRANS_NONE );
  assert( wrFlag==0 || p->inTrans==TRANS_WRITE );
  assert( pBt->pPage1 && pBt->pPage1->aData );
  assert( wrFlag==0 || (pBt->btsFlags & BTS_READ_ONLY)==0 );

  if( wrFlag ){
    allocateTempSpace(pBt);
    if( pBt->pTmpSpace==0 ) return SQLITE_NOMEM_BKPT;
  }
  if( iTable==1 && btreePagecount(pBt)==0 ){
    assert( wrFlag==0 );
    iTable = 0;
  }

  /* Now that no other errors can occur, finish filling in the BtCursor
  ** variables and link the cursor into the BtShared list.  */
  pCur->pgnoRoot = (Pgno)iTable;
  pCur->iPage = -1;
  pCur->pKeyInfo = pKeyInfo;
  pCur->pBtree = p;
  pCur->pBt = pBt;
  pCur->curFlags = wrFlag ? BTCF_WriteFlag : 0;
  pCur->curPagerFlags = wrFlag ? 0 : PAGER_GET_READONLY;
  /* If there are two or more cursors on the same btree, then all such
  ** cursors *must* have the BTCF_Multiple flag set. */
  for(pX=pBt->pCursor; pX; pX=pX->pNext){
    if( pX->pgnoRoot==(Pgno)iTable ){
      pX->curFlags |= BTCF_Multiple;
      pCur->curFlags |= BTCF_Multiple;
    }
  }
  pCur->pNext = pBt->pCursor;
  pBt->pCursor = pCur;
  pCur->eState = CURSOR_INVALID;
  return SQLITE_OK;
}